

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

uint SimpleString::AtoU(char *str)

{
  bool bVar1;
  bool bVar2;
  uint local_14;
  char *pcStack_10;
  uint result;
  char *str_local;
  
  pcStack_10 = str;
  while (bVar1 = isSpace(*pcStack_10), bVar1) {
    pcStack_10 = pcStack_10 + 1;
  }
  local_14 = 0;
  while( true ) {
    bVar2 = isDigit(*pcStack_10);
    bVar1 = false;
    if (bVar2) {
      bVar1 = '/' < *pcStack_10;
    }
    if (!bVar1) break;
    local_14 = *pcStack_10 + -0x30 + local_14 * 10;
    pcStack_10 = pcStack_10 + 1;
  }
  return local_14;
}

Assistant:

unsigned SimpleString::AtoU(const char* str)
{
    while (isSpace(*str)) str++;

    unsigned result = 0;
    for(; isDigit(*str) && *str >= '0'; str++)
    {
        result *= 10;
        result += static_cast<unsigned>(*str - '0');
    }
    return result;
}